

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorwiseOp.h
# Opt level: O1

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::VectorwiseOp<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::operator+=
          (VectorwiseOp<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *this,
          DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *other)

{
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  Index col;
  long lVar6;
  Index row;
  long lVar7;
  
  pMVar1 = *(Matrix<double,__1,__1,_0,__1,__1> **)this;
  lVar2 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols;
  if (lVar2 == (*(long **)other)[1]) {
    if (0 < lVar2) {
      lVar3 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
      lVar4 = **(long **)other;
      pdVar5 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      lVar6 = 0;
      do {
        if (0 < lVar3) {
          lVar7 = 0;
          do {
            pdVar5[lVar7] = *(double *)(lVar4 + lVar6 * 8) + pdVar5[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar3 != lVar7);
        }
        lVar6 = lVar6 + 1;
        pdVar5 = pdVar5 + lVar3;
      } while (lVar6 != lVar2);
    }
    return pMVar1;
  }
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/AssignEvaluator.h"
                ,0x2c6,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
    ExpressionType& operator+=(const DenseBase<OtherDerived>& other)
    {
      EIGEN_STATIC_ASSERT_VECTOR_ONLY(OtherDerived)
      EIGEN_STATIC_ASSERT_SAME_XPR_KIND(ExpressionType, OtherDerived)
      return const_cast<ExpressionType&>(m_matrix += extendedTo(other.derived()));
    }